

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

void y4m_convert_mono_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  long in_RSI;
  int *in_RDI;
  int c_sz;
  
  memset((void *)(in_RSI + *in_RDI * in_RDI[1]),0x80,
         (long)(((*in_RDI + in_RDI[9] + -1) / in_RDI[9]) *
                ((in_RDI[1] + in_RDI[10] + -1) / in_RDI[10]) * 2));
  return;
}

Assistant:

static void y4m_convert_mono_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                     unsigned char *_aux) {
  int c_sz;
  (void)_aux;
  _dst += _y4m->pic_w * _y4m->pic_h;
  c_sz = ((_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h) *
         ((_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v);
  memset(_dst, 128, c_sz * 2);
}